

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void dump_symbol_table(SymbolTable *s)

{
  Bucket *pBVar1;
  Bucket *pBVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  SymbolInfo *pSVar6;
  
  uVar5 = 0;
  for (uVar4 = 0; uVar4 != 0xfd; uVar4 = uVar4 + 1) {
    pBVar1 = s->bucket[uVar4];
    if (0 < pBVar1->num_symbols) {
      printf("Bucket #%d:\n---------------\n",uVar4 & 0xffffffff);
      lVar3 = 0;
      pBVar2 = pBVar1;
      while( true ) {
        pSVar6 = &pBVar2->symbol[0].value;
        if (pBVar1->num_symbols <= lVar3) break;
        printf("\t\"%s\"\t:\t%ld\n",pBVar2->symbol[0].name,pSVar6->n);
        lVar3 = lVar3 + 1;
        pBVar2 = (Bucket *)pSVar6;
      }
      uVar5 = (uVar5 + pBVar1->num_symbols) - 1;
    }
  }
  printf("Total collisions: %d\n",(ulong)uVar5);
  return;
}

Assistant:

void
dump_symbol_table (const SymbolTable *s)
{
  const Bucket *b;
  int i, j, collisions;

  for (i = collisions = 0; i < HASH_BUCKETS; i++)
    {
      b = s->bucket[i];
      if (b->num_symbols > 0)
	{
	  printf ("Bucket #%d:\n---------------\n", i);
	  for (j = 0; j < b->num_symbols; j++)
	    printf ("\t\"%s\"\t:\t%ld\n", b->symbol[j].name,
		    b->symbol[j].value.n);
	  collisions += b->num_symbols - 1;
	}
    }

  printf ("Total collisions: %d\n", collisions);
}